

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchWaitController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchWaitController **ppWaitController)

{
  WaitDomain wdWaitDomain_00;
  CSynchWaitController *pobj;
  CSynchData *local_68;
  CSynchData *psdSynchData;
  WaitDomain wdWaitDomain;
  CSynchWaitController *pCtrlr;
  PAL_ERROR palErr;
  ISynchWaitController **ppWaitController_local;
  ObjectDomain odObjectDomain_local;
  VOID *pvSynchData_local;
  CObjectType *potObjectType_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pCtrlr._4_4_ = 0;
  wdWaitDomain_00 = LocalWait;
  local_68 = (CSynchData *)pvSynchData;
  if (odObjectDomain == SharedObject) {
    wdWaitDomain_00 = SharedWait;
    local_68 = (CSynchData *)SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  pobj = CSynchCache<CorUnix::CSynchWaitController>::Get(&this->m_cacheWaitCtrlrs,pthrCurrent);
  if (pobj == (CSynchWaitController *)0x0) {
    pCtrlr._4_4_ = 8;
  }
  else {
    CSynchControllerBase::Init
              (&pobj->super_CSynchControllerBase,pthrCurrent,WaitController,odObjectDomain,
               potObjectType,local_68,wdWaitDomain_00);
    *ppWaitController = &pobj->super_ISynchWaitController;
  }
  if ((pCtrlr._4_4_ != 0) && (pobj != (CSynchWaitController *)0x0)) {
    CSynchCache<CorUnix::CSynchWaitController>::Add(&this->m_cacheWaitCtrlrs,pthrCurrent,pobj);
  }
  return pCtrlr._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchWaitController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchWaitController **ppWaitController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchWaitController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheWaitCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSWC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::WaitController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppWaitController = (ISynchWaitController *)pCtrlr;

    CSWC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheWaitCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }